

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O2

void __thiscall
send_lambda<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>
::operator()(send_lambda<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>
             *this,message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                   *msg)

{
  bool bVar1;
  serializer<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  sr;
  serializer<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_1b0;
  
  bVar1 = boost::beast::http::
          message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
          ::need_eof(msg);
  *(bool *)*(undefined8 *)(this + 8) = bVar1;
  local_1b0.wr_.body_ =
       &(msg->super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>)
        .value_;
  local_1b0.fwr_.super_type.m_initialized = false;
  local_1b0.v_.i_ = '\0';
  local_1b0.pv_.i_ = '\0';
  local_1b0.limit_ = 0xffffffffffffffff;
  local_1b0.s_ = 0;
  local_1b0.split_ = false;
  local_1b0.header_done_ = false;
  local_1b0.more_ = false;
  local_1b0.m_ = msg;
  boost::beast::http::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,false,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,boost::beast::http::basic_fields<std::allocator<char>>>
            (*(basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               **)this,&local_1b0,*(error_code **)(this + 0x10));
  boost::beast::http::
  serializer<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~serializer(&local_1b0);
  return;
}

Assistant:

void operator()(http::message<isRequest, Body, Fields>&& msg) const {
        // Determine if we should close the connection after
        close_ = msg.need_eof();

        // We need the serializer here because the serializer requires
        // a non-const file_body, and the message oriented version of
        // http::write only works with const messages.
        http::serializer<isRequest, Body, Fields> sr{msg};
        http::write(stream_, sr, ec_);
    }